

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::EnableDisableAttributesTest
          (EnableDisableAttributesTest *this,Context *context)

{
  Context *context_local;
  EnableDisableAttributesTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"vertex_arrays_enable_disable_attributes",
             "Vertex Array Objects Enable Disable Attributes Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__EnableDisableAttributesTest_0323f928;
  this->m_po_even = 0;
  this->m_po_odd = 0;
  this->m_vao = 0;
  this->m_bo = 0;
  this->m_bo_xfb = 0;
  this->m_max_attributes = 0x10;
  return;
}

Assistant:

EnableDisableAttributesTest::EnableDisableAttributesTest(deqp::Context& context)
	: deqp::TestCase(context, "vertex_arrays_enable_disable_attributes",
					 "Vertex Array Objects Enable Disable Attributes Test")
	, m_po_even(0)
	, m_po_odd(0)
	, m_vao(0)
	, m_bo(0)
	, m_bo_xfb(0)
	, m_max_attributes(16) /* Required Minimum: OpenGL 4.5 Table 23.57: Implementation Dependent Vertex Shader Limits */
{
	/* Intentionally left blank. */
}